

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

interpolator * interp_create(uint taps,uint factor,uint channels)

{
  uint uVar1;
  interpolator *__ptr;
  interp_filter *piVar2;
  uint *puVar3;
  double *pdVar4;
  float **ppfVar5;
  float *pfVar6;
  uint uVar7;
  double dVar8;
  uint t;
  uint f;
  double c;
  double m;
  uint j;
  interpolator *interp;
  int errcode;
  uint channels_local;
  uint factor_local;
  uint taps_local;
  
  __ptr = (interpolator *)calloc(1,0x28);
  if (__ptr != (interpolator *)0x0) {
    __ptr->taps = taps;
    __ptr->factor = factor;
    __ptr->channels = channels;
    __ptr->delay = ((__ptr->taps + __ptr->factor) - 1) / __ptr->factor;
    piVar2 = (interp_filter *)calloc((ulong)__ptr->factor,0x18);
    __ptr->filter = piVar2;
    if (__ptr->filter != (interp_filter *)0x0) {
      for (m._4_4_ = 0; m._4_4_ < __ptr->factor; m._4_4_ = m._4_4_ + 1) {
        puVar3 = (uint *)calloc((ulong)__ptr->delay,4);
        __ptr->filter[m._4_4_].index = puVar3;
        pdVar4 = (double *)calloc((ulong)__ptr->delay,8);
        __ptr->filter[m._4_4_].coeff = pdVar4;
        if ((__ptr->filter[m._4_4_].index == (uint *)0x0) ||
           (__ptr->filter[m._4_4_].coeff == (double *)0x0)) goto LAB_0010c3c9;
      }
      ppfVar5 = (float **)calloc((ulong)__ptr->channels,8);
      __ptr->z = ppfVar5;
      if (__ptr->z != (float **)0x0) {
        m._4_4_ = 0;
        while( true ) {
          if (__ptr->channels <= m._4_4_) {
            for (m._4_4_ = 0; m._4_4_ < __ptr->taps; m._4_4_ = m._4_4_ + 1) {
              dVar8 = (double)m._4_4_ - (double)(__ptr->taps - 1) / 2.0;
              _t = 1.0;
              if (1e-06 < ABS(dVar8)) {
                _t = sin((dVar8 * 3.141592653589793) / (double)__ptr->factor);
                _t = _t / ((dVar8 * 3.141592653589793) / (double)__ptr->factor);
              }
              dVar8 = cos(((double)m._4_4_ * 6.283185307179586) / (double)(__ptr->taps - 1));
              _t = (1.0 - dVar8) * 0.5 * _t;
              if (1e-06 < ABS(_t)) {
                uVar7 = m._4_4_ % __ptr->factor;
                uVar1 = __ptr->filter[uVar7].count;
                __ptr->filter[uVar7].count = uVar1 + 1;
                __ptr->filter[uVar7].coeff[uVar1] = _t;
                __ptr->filter[uVar7].index[uVar1] = m._4_4_ / __ptr->factor;
              }
            }
            return __ptr;
          }
          pfVar6 = (float *)calloc((ulong)__ptr->delay,4);
          __ptr->z[m._4_4_] = pfVar6;
          if (__ptr->z[m._4_4_] == (float *)0x0) break;
          m._4_4_ = m._4_4_ + 1;
        }
        for (m._4_4_ = 0; m._4_4_ < __ptr->channels; m._4_4_ = m._4_4_ + 1) {
          free(__ptr->z[m._4_4_]);
        }
        free(__ptr->z);
      }
LAB_0010c3c9:
      for (m._4_4_ = 0; m._4_4_ < __ptr->factor; m._4_4_ = m._4_4_ + 1) {
        free(__ptr->filter[m._4_4_].index);
        free(__ptr->filter[m._4_4_].coeff);
      }
      free(__ptr->filter);
    }
    free(__ptr);
  }
  return (interpolator *)0x0;
}

Assistant:

static interpolator*
interp_create(unsigned int taps, unsigned int factor, unsigned int channels) {
  int errcode; /* unused */
  interpolator* interp;
  unsigned int j;

  interp = (interpolator*) calloc(1, sizeof(interpolator));
  CHECK_ERROR(!interp, 0, exit);

  interp->taps = taps;
  interp->factor = factor;
  interp->channels = channels;
  interp->delay = (interp->taps + interp->factor - 1) / interp->factor;

  /* Initialize the filter memory
   * One subfilter per interpolation factor. */
  interp->filter =
      (interp_filter*) calloc(interp->factor, sizeof(*interp->filter));
  CHECK_ERROR(!interp->filter, 0, free_interp);

  for (j = 0; j < interp->factor; j++) {
    interp->filter[j].index =
        (unsigned int*) calloc(interp->delay, sizeof(unsigned int));
    interp->filter[j].coeff = (double*) calloc(interp->delay, sizeof(double));
    CHECK_ERROR(!interp->filter[j].index || !interp->filter[j].coeff, 0,
                free_filter_index_coeff);
  }

  /* One delay buffer per channel. */
  interp->z = (float**) calloc(interp->channels, sizeof(float*));
  CHECK_ERROR(!interp->z, 0, free_filter_index_coeff);
  for (j = 0; j < interp->channels; j++) {
    interp->z[j] = (float*) calloc(interp->delay, sizeof(float));
    CHECK_ERROR(!interp->z[j], 0, free_filter_z);
  }

  /* Calculate the filter coefficients */
  for (j = 0; j < interp->taps; j++) {
    /* Calculate sinc */
    double m = (double) j - (double) (interp->taps - 1) / 2.0;
    double c = 1.0;
    if (fabs(m) > ALMOST_ZERO) {
      c = sin(m * M_PI / interp->factor) / (m * M_PI / interp->factor);
    }
    /* Apply Hanning window */
    c *= 0.5 * (1 - cos(2 * M_PI * j / (interp->taps - 1)));

    if (fabs(c) > ALMOST_ZERO) { /* Ignore any zero coeffs. */
      /* Put the coefficient into the correct subfilter */
      unsigned int f = j % interp->factor;
      unsigned int t = interp->filter[f].count++;
      interp->filter[f].coeff[t] = c;
      interp->filter[f].index[t] = j / interp->factor;
    }
  }
  return interp;

free_filter_z:
  for (j = 0; j < interp->channels; j++) {
    free(interp->z[j]);
  }
  free(interp->z);
free_filter_index_coeff:
  for (j = 0; j < interp->factor; j++) {
    free(interp->filter[j].index);
    free(interp->filter[j].coeff);
  }
  free(interp->filter);
free_interp:
  free(interp);
exit:
  return NULL;
}